

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

TRANSFER_HANDLE transfer_create(handle handle_value)

{
  int iVar1;
  TRANSFER_INSTANCE_TAG TVar2;
  AMQP_VALUE item_value;
  undefined4 local_24;
  int result;
  AMQP_VALUE handle_amqp_value;
  TRANSFER_INSTANCE *transfer_instance;
  handle handle_value_local;
  
  handle_amqp_value = (AMQP_VALUE)malloc(8);
  if (handle_amqp_value != (AMQP_VALUE)0x0) {
    TVar2.composite_value = amqpvalue_create_composite_with_ulong_descriptor(0x14);
    *(AMQP_VALUE *)handle_amqp_value = TVar2.composite_value;
    if (*(AMQP_VALUE *)handle_amqp_value == (AMQP_VALUE)0x0) {
      free(handle_amqp_value);
      handle_amqp_value = (AMQP_VALUE)0x0;
    }
    else {
      local_24 = 0;
      item_value = amqpvalue_create_handle(handle_value);
      iVar1 = amqpvalue_set_composite_item(*(AMQP_VALUE *)handle_amqp_value,0,item_value);
      if (iVar1 != 0) {
        local_24 = 0x1ab1;
      }
      amqpvalue_destroy(item_value);
      if (local_24 != 0) {
        transfer_destroy((TRANSFER_HANDLE)handle_amqp_value);
        handle_amqp_value = (AMQP_VALUE)0x0;
      }
    }
  }
  return (TRANSFER_HANDLE)handle_amqp_value;
}

Assistant:

TRANSFER_HANDLE transfer_create(handle handle_value)
{
    TRANSFER_INSTANCE* transfer_instance = (TRANSFER_INSTANCE*)malloc(sizeof(TRANSFER_INSTANCE));
    if (transfer_instance != NULL)
    {
        transfer_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(20);
        if (transfer_instance->composite_value == NULL)
        {
            free(transfer_instance);
            transfer_instance = NULL;
        }
        else
        {
            AMQP_VALUE handle_amqp_value;
            int result = 0;

            handle_amqp_value = amqpvalue_create_handle(handle_value);
            if ((result == 0) && (amqpvalue_set_composite_item(transfer_instance->composite_value, 0, handle_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }

            amqpvalue_destroy(handle_amqp_value);
            if (result != 0)
            {
                transfer_destroy(transfer_instance);
                transfer_instance = NULL;
            }
        }
    }

    return transfer_instance;
}